

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetPropertyComputer.h
# Opt level: O3

cmValue cmTargetPropertyComputer::GetLocation<cmTarget>(cmTarget *tgt,string *prop,cmMakefile *mf)

{
  uint uVar1;
  pointer pcVar2;
  _Head_base<0UL,_cmTargetInternals_*,_false> _Var3;
  bool bVar4;
  int iVar5;
  string *psVar6;
  pointer __s1;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  basic_string_view<char,_std::char_traits<char>_> __str_01;
  string configName;
  string local_50;
  
  uVar1 = ((tgt->impl)._M_t.
           super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
           super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
           super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->TargetType;
  if ((3 < uVar1) && (uVar1 != 8)) {
    return (cmValue)(string *)0x0;
  }
  if ((GetLocation<cmTarget>(cmTarget_const*,std::__cxx11::string_const&,cmMakefile_const&)::
       propLOCATION_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&GetLocation<cmTarget>(cmTarget_const*,std::__cxx11::string_const&,cmMakefile_const&)
                                   ::propLOCATION_abi_cxx11_), iVar5 != 0)) {
    GetLocation<cmTarget>(cmTarget_const*,std::__cxx11::string_const&,cmMakefile_const&)::
    propLOCATION_abi_cxx11_._M_dataplus._M_p =
         (pointer)&GetLocation<cmTarget>(cmTarget_const*,std::__cxx11::string_const&,cmMakefile_const&)
                   ::propLOCATION_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &GetLocation<cmTarget>(cmTarget_const*,std::__cxx11::string_const&,cmMakefile_const&)
                ::propLOCATION_abi_cxx11_,"LOCATION","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetLocation<cmTarget>(cmTarget_const*,std::__cxx11::string_const&,cmMakefile_const&)
                  ::propLOCATION_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&GetLocation<cmTarget>(cmTarget_const*,std::__cxx11::string_const&,cmMakefile_const&)
                         ::propLOCATION_abi_cxx11_);
  }
  pcVar2 = (pointer)prop->_M_string_length;
  if (pcVar2 == (pointer)GetLocation<cmTarget>(cmTarget_const*,std::__cxx11::string_const&,cmMakefile_const&)
                         ::propLOCATION_abi_cxx11_._M_string_length) {
    if (pcVar2 != (pointer)0x0) {
      __s1 = (prop->_M_dataplus)._M_p;
      iVar5 = bcmp(__s1,GetLocation<cmTarget>(cmTarget_const*,std::__cxx11::string_const&,cmMakefile_const&)
                        ::propLOCATION_abi_cxx11_._M_dataplus._M_p,(size_t)pcVar2);
      if (iVar5 != 0) goto LAB_0028ba0a;
    }
    _Var3._M_head_impl =
         (tgt->impl)._M_t.
         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
         super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
    if (((_Var3._M_head_impl)->IsImportedTarget != false) ||
       (bVar4 = HandleLocationPropertyPolicy(&(_Var3._M_head_impl)->Name,mf), bVar4)) {
      ComputeLocationForBuild<cmTarget>(tgt);
      return (cmValue)&ComputeLocationForBuild<cmTarget>(cmTarget_const*)::loc_abi_cxx11_;
    }
  }
  else {
    __s1 = (prop->_M_dataplus)._M_p;
LAB_0028ba0a:
    __str._M_str = "LOCATION_";
    __str._M_len = 9;
    local_50._M_dataplus._M_p = pcVar2;
    local_50._M_string_length = (size_type)__s1;
    iVar5 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                      ((basic_string_view<char,_std::char_traits<char>_> *)&local_50,0,9,__str);
    if (iVar5 == 0) {
      _Var3._M_head_impl =
           (tgt->impl)._M_t.
           super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
           super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
           super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
      if (((_Var3._M_head_impl)->IsImportedTarget != false) ||
         (bVar4 = HandleLocationPropertyPolicy(&(_Var3._M_head_impl)->Name,mf), bVar4)) {
        std::__cxx11::string::substr((ulong)&local_50,(ulong)prop);
        ComputeLocation<cmTarget>(tgt,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        return (cmValue)&ComputeLocation<cmTarget>(cmTarget_const*,std::__cxx11::string_const&)::
                         loc_abi_cxx11_;
      }
    }
    else {
      local_50._M_string_length = (size_type)(prop->_M_dataplus)._M_p;
      local_50._M_dataplus._M_p = (pointer)prop->_M_string_length;
      if (((pointer)0x8 < local_50._M_dataplus._M_p) &&
         (__str_00._M_str = "_LOCATION", __str_00._M_len = 9,
         iVar5 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                           ((basic_string_view<char,_std::char_traits<char>_> *)&local_50,
                            (size_type)(local_50._M_dataplus._M_p + -9),9,__str_00), iVar5 == 0)) {
        local_50._M_string_length = (size_type)(prop->_M_dataplus)._M_p;
        local_50._M_dataplus._M_p = (pointer)prop->_M_string_length;
        __str_01._M_str = "XCODE_ATTRIBUTE_";
        __str_01._M_len = 0x10;
        iVar5 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                          ((basic_string_view<char,_std::char_traits<char>_> *)&local_50,0,0x10,
                           __str_01);
        if (iVar5 != 0) {
          pcVar2 = (prop->_M_dataplus)._M_p;
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,pcVar2,pcVar2 + (prop->_M_string_length - 9));
          iVar5 = std::__cxx11::string::compare((char *)&local_50);
          psVar6 = (string *)tgt;
          if (iVar5 != 0) {
            _Var3._M_head_impl =
                 (tgt->impl)._M_t.
                 super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                 .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
            if (((_Var3._M_head_impl)->IsImportedTarget != false) ||
               (bVar4 = HandleLocationPropertyPolicy(&(_Var3._M_head_impl)->Name,mf), bVar4)) {
              ComputeLocation<cmTarget>(tgt,&local_50);
              psVar6 = &ComputeLocation<cmTarget>(cmTarget_const*,std::__cxx11::string_const&)::
                        loc_abi_cxx11_;
            }
            else {
              psVar6 = (string *)0x0;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          if (iVar5 != 0) {
            return (cmValue)psVar6;
          }
        }
      }
    }
  }
  return (cmValue)(string *)0x0;
}

Assistant:

static cmValue GetLocation(Target const* tgt, std::string const& prop,
                             cmMakefile const& mf)

  {
    // Watch for special "computed" properties that are dependent on
    // other properties or variables.  Always recompute them.
    if (tgt->GetType() == cmStateEnums::EXECUTABLE ||
        tgt->GetType() == cmStateEnums::STATIC_LIBRARY ||
        tgt->GetType() == cmStateEnums::SHARED_LIBRARY ||
        tgt->GetType() == cmStateEnums::MODULE_LIBRARY ||
        tgt->GetType() == cmStateEnums::UNKNOWN_LIBRARY) {
      static const std::string propLOCATION = "LOCATION";
      if (prop == propLOCATION) {
        if (!tgt->IsImported() &&
            !HandleLocationPropertyPolicy(tgt->GetName(), mf)) {
          return nullptr;
        }
        return cmValue(ComputeLocationForBuild(tgt));
      }

      // Support "LOCATION_<CONFIG>".
      if (cmHasLiteralPrefix(prop, "LOCATION_")) {
        if (!tgt->IsImported() &&
            !HandleLocationPropertyPolicy(tgt->GetName(), mf)) {
          return nullptr;
        }
        std::string configName = prop.substr(9);
        return cmValue(ComputeLocation(tgt, configName));
      }

      // Support "<CONFIG>_LOCATION".
      if (cmHasLiteralSuffix(prop, "_LOCATION") &&
          !cmHasLiteralPrefix(prop, "XCODE_ATTRIBUTE_")) {
        std::string configName(prop.c_str(), prop.size() - 9);
        if (configName != "IMPORTED") {
          if (!tgt->IsImported() &&
              !HandleLocationPropertyPolicy(tgt->GetName(), mf)) {
            return nullptr;
          }
          return cmValue(ComputeLocation(tgt, configName));
        }
      }
    }
    return nullptr;
  }